

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlElementHandler.cpp
# Opt level: O1

void __thiscall
TestXmlElementHandler::endHeader(TestXmlElementHandler *this,Header *header,QDomElement *xmlElement)

{
  int iVar1;
  undefined8 extraout_RAX;
  longlong __tmp;
  QChar *pQVar2;
  QByteArrayView QVar3;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  char *local_38;
  QByteArrayView local_30;
  
  QDomElement::tagName();
  pQVar2 = (QChar *)local_50.ptr;
  if ((QChar *)local_50.ptr == (QChar *)0x0) {
    pQVar2 = (QChar *)&QString::_empty;
  }
  iVar1 = QString::compare_helper(pQVar2,local_50.size,"header",-1,CaseSensitive);
  if (iVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    local_38 = "endHeader";
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_30,&local_38);
    QVar3.m_data = (storage_type *)local_30.m_size;
    QVar3.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar3);
    local_68.d = local_50.d;
    local_68.ptr = local_50.ptr;
    local_50.d = (Data *)0x0;
    local_50.ptr = (char16_t *)0x0;
    local_68.size = local_50.size;
    local_50.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&this->cb,(this->cb).d.size,(QString *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    return;
  }
  endHeader();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void TestXmlElementHandler::endHeader(KDReports::Header &header, const QDomElement &xmlElement)
{
    Q_UNUSED(header);
    Q_UNUSED(xmlElement); // unused in release mode
    Q_ASSERT(xmlElement.tagName() == "header");
    cb << "endHeader";
}